

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_set_in_callback(Curl_easy *data,_Bool value)

{
  Curl_multi *pCVar1;
  
  if ((data != (Curl_easy *)0x0) &&
     ((pCVar1 = data->multi_easy, pCVar1 != (Curl_multi *)0x0 ||
      (pCVar1 = data->multi, pCVar1 != (Curl_multi *)0x0)))) {
    pCVar1->field_0x1b1 = pCVar1->field_0x1b1 & 0xfb | value << 2;
  }
  return;
}

Assistant:

void Curl_set_in_callback(struct Curl_easy *data, bool value)
{
  /* might get called when there is no data pointer! */
  if(data) {
    if(data->multi_easy)
      data->multi_easy->in_callback = value;
    else if(data->multi)
      data->multi->in_callback = value;
  }
}